

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O0

void duckdb::DatePartCachedFunction<duckdb::DatePart::YearOperator,duckdb::timestamp_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  anon_class_8_1_5ffa18e3 fun;
  reference result_00;
  Vector *in_RDX;
  DataChunk *in_RDI;
  DateCacheLocalState<duckdb::DatePart::YearOperator> *lstate;
  ExpressionState *in_stack_ffffffffffffffb8;
  FunctionLocalState *in_stack_ffffffffffffffc0;
  
  ExecuteFunctionState::GetFunctionState(in_stack_ffffffffffffffb8);
  optional_ptr<duckdb::FunctionLocalState,_true>::operator->
            ((optional_ptr<duckdb::FunctionLocalState,_true> *)in_stack_ffffffffffffffc0);
  fun.lstate = FunctionLocalState::Cast<duckdb::DateCacheLocalState<duckdb::DatePart::YearOperator>>
                         (in_stack_ffffffffffffffc0);
  result_00 = vector<duckdb::Vector,_true>::operator[]
                        ((vector<duckdb::Vector,_true> *)in_stack_ffffffffffffffc0,
                         (size_type)in_stack_ffffffffffffffb8);
  DataChunk::size(in_RDI);
  UnaryExecutor::
  ExecuteWithNulls<duckdb::timestamp_t,long,duckdb::DatePartCachedFunction<duckdb::DatePart::YearOperator,duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
            (in_RDX,result_00,(idx_t)in_stack_ffffffffffffffb8,fun);
  return;
}

Assistant:

static void DatePartCachedFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &lstate = ExecuteFunctionState::GetFunctionState(state)->Cast<DateCacheLocalState<OP>>();
	UnaryExecutor::ExecuteWithNulls<T, int64_t>(
	    args.data[0], result, args.size(),
	    [&](T input, ValidityMask &mask, idx_t idx) { return lstate.cache.ExtractElement(input, mask, idx); });
}